

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.cpp
# Opt level: O2

void Assimp::FBX::Node::WritePropertyNodeBinary
               (string *name,vector<double,_std::allocator<double>_> *v,StreamWriterLE *s)

{
  double *pdVar1;
  Node node;
  
  Node(&node,name);
  BeginBinary(&node,s);
  StreamWriter<false,_false>::Put<unsigned_char>(s,'d');
  StreamWriter<false,_false>::Put<unsigned_int>
            (s,(uint)((ulong)((long)(v->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                                    .super__Vector_impl_data._M_finish -
                             (long)(v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                   super__Vector_impl_data._M_start) >> 3));
  StreamWriter<false,_false>::Put<unsigned_int>(s,0);
  StreamWriter<false,_false>::Put<unsigned_int>
            (s,*(int *)&(v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
               *(int *)&(v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start & 0xfffffff8);
  for (pdVar1 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pdVar1 != (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish; pdVar1 = pdVar1 + 1) {
    StreamWriter<false,_false>::Put<double>(s,*pdVar1);
  }
  EndPropertiesBinary(&node,s,1);
  EndBinary(&node,s,false);
  ~Node(&node);
  return;
}

Assistant:

void FBX::Node::WritePropertyNodeBinary(
    const std::string& name,
    const std::vector<double>& v,
    Assimp::StreamWriterLE& s
){
    FBX::Node node(name);
    node.BeginBinary(s);
    s.PutU1('d');
    s.PutU4(uint32_t(v.size())); // number of elements
    s.PutU4(0); // no encoding (1 would be zip-compressed)
    s.PutU4(uint32_t(v.size()) * 8); // data size
    for (auto it = v.begin(); it != v.end(); ++it) { s.PutF8(*it); }
    node.EndPropertiesBinary(s, 1);
    node.EndBinary(s, false);
}